

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_init_sockets
              (rtr_mgr_group *group,rtr_mgr_config *config,uint refresh_interval,
              uint expire_interval,uint retry_interval,rtr_interval_mode iv_mode)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_54;
  rtr_rtvals err_code;
  uint i;
  rtr_interval_mode iv_mode_local;
  uint retry_interval_local;
  uint expire_interval_local;
  uint refresh_interval_local;
  rtr_mgr_config *config_local;
  rtr_mgr_group *group_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_54 = 0; local_54 < group->sockets_len; local_54 = local_54 + 1) {
    group_local._4_4_ =
         rtr_init(group->sockets[local_54],(tr_socket *)0x0,config->pfx_table,config->spki_table,
                  config->aspa_table,refresh_interval,expire_interval,retry_interval,iv_mode,
                  rtr_mgr_cb,config,group);
    if (group_local._4_4_ != 0) goto LAB_00105e86;
  }
  group_local._4_4_ = 0;
LAB_00105e86:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return group_local._4_4_;
}

Assistant:

static int rtr_mgr_init_sockets(struct rtr_mgr_group *group, struct rtr_mgr_config *config,
				const unsigned int refresh_interval, const unsigned int expire_interval,
				const unsigned int retry_interval, enum rtr_interval_mode iv_mode)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		enum rtr_rtvals err_code = rtr_init(group->sockets[i], NULL, config->pfx_table, config->spki_table,
						    config->aspa_table, refresh_interval, expire_interval,
						    retry_interval, iv_mode, rtr_mgr_cb, config, group);
		if (err_code)
			return err_code;
	}
	return RTR_SUCCESS;
}